

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,StringRef error)

{
  StringRef name;
  ScopedElement *in_RDX;
  ScopedElement *in_RDI;
  StringRef SVar1;
  size_t in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff78;
  XmlFormatting fmt;
  string *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  XmlFormatting in_stack_ffffffffffffff8c;
  allocator<char> *in_stack_ffffffffffffff90;
  XmlWriter *this_00;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_49;
  string local_48 [64];
  ScopedElement *pSStack_8;
  
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pSStack_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,fmt);
  SVar1 = operator____sr((char *)in_RDI,in_stack_ffffffffffffff58);
  this_00 = (XmlWriter *)SVar1.m_start;
  name.m_size = (size_type)in_stack_ffffffffffffffa0;
  name.m_start = (char *)SVar1.m_size;
  SVar1.m_start._4_4_ = in_stack_ffffffffffffff8c;
  SVar1.m_start._0_4_ = in_stack_ffffffffffffff88;
  SVar1.m_size = (size_type)this_00;
  XmlWriter::ScopedElement::writeAttribute(pSStack_8,name,SVar1);
  XmlWriter::ScopedElement::~ScopedElement(in_RDI);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  operator|(Newline,Indent);
  XmlWriter::endElement(this_00,in_stack_ffffffffffffff8c);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(StringRef error) {
        m_xml.scopedElement("failed").
            writeAttribute("message"_sr, error);
        m_xml.endElement();
    }